

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

Action __thiscall
psy::C::TypeChecker::visitIdentifierName(TypeChecker *this,IdentifierNameSyntax *node)

{
  DeclarationCategory DVar1;
  int iVar2;
  Scope *this_00;
  Identifier *ident;
  DeclarationSymbol *this_01;
  Compilation *pCVar3;
  Type *pTVar4;
  MIXIN_TypeableDeclarationSymbol *pMVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  MIXIN_TypeableDeclarationSymbol *typeableDecl;
  DeclarationSymbol *decl;
  Scope *scope;
  IdentifierNameSyntax *node_local;
  TypeChecker *this_local;
  
  this_00 = SemanticModel::scopeOf(this->semaModel_,node);
  if (this_00 == (Scope *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x263);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::operator<<(poVar6,"<empty message>");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = Quit;
  }
  else {
    ident = identifierFrom(node);
    this_01 = Scope::searchForDeclaration(this_00,ident,OrdinaryIdentifiers);
    if (this_01 == (DeclarationSymbol *)0x0) {
      pCVar3 = SemanticModel::compilation(this->semaModel_);
      pTVar4 = &Compilation::canonicalErrorType(pCVar3)->super_Type;
      this->ty_ = pTVar4;
    }
    else {
      DVar1 = DeclarationSymbol::category(this_01);
      if (DVar1 < Type) {
        pMVar5 = MIXIN_TypeableDeclarationSymbol::from(this_01);
        if (pMVar5 == (MIXIN_TypeableDeclarationSymbol *)0x0) {
          poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar6 = std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                                  );
          poVar6 = std::operator<<(poVar6,":");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x26f);
          poVar6 = std::operator<<(poVar6," ");
          poVar6 = std::operator<<(poVar6,"<empty message>");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          return Quit;
        }
        iVar2 = (*pMVar5->_vptr_MIXIN_TypeableDeclarationSymbol[2])();
        this->ty_ = (Type *)CONCAT44(extraout_var,iVar2);
      }
      else if (DVar1 == Type) {
        pCVar3 = SemanticModel::compilation(this->semaModel_);
        pTVar4 = &Compilation::canonicalErrorType(pCVar3)->super_Type;
        this->ty_ = pTVar4;
      }
    }
    this_local._7_1_ = Skip;
  }
  return this_local._7_1_;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitIdentifierName(const IdentifierNameSyntax* node)
{
    auto scope = semaModel_->scopeOf(node);
    PSY_ASSERT_2(scope, return Action::Quit);
    auto decl = scope->searchForDeclaration(
                identifierFrom(node),
                NameSpace::OrdinaryIdentifiers);
    if (!decl)
        ty_ = semaModel_->compilation()->canonicalErrorType();
    else {
        switch (decl->category()) {
            case DeclarationCategory::Member:
            case DeclarationCategory::Function:
            case DeclarationCategory::Object: {
                auto typeableDecl = MIXIN_TypeableDeclarationSymbol::from(decl);
                PSY_ASSERT_2(typeableDecl, return Action::Quit);
                ty_ = typeableDecl->type();
                break;
            }
            case DeclarationCategory::Type:
                ty_ = semaModel_->compilation()->canonicalErrorType();
                break;
        }
    }

    return Action::Skip;
}